

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::_InternalParse
          (CodeGeneratorRequest *this,char *ptr,ParseContext *ctx)

{
  ParseContext *pPVar1;
  bool bVar2;
  string *psVar3;
  Version *msg;
  FileDescriptorProto *msg_00;
  ulong tag_00;
  UnknownFieldSet *unknown;
  string *str_1;
  string *str;
  uint32_t tag;
  HasBits has_bits;
  ParseContext *ctx_local;
  char *ptr_local;
  CodeGeneratorRequest *this_local;
  
  _tag = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  internal::HasBits<1UL>::HasBits((HasBits<1UL> *)((long)&str + 4));
LAB_004d7b25:
  do {
    bVar2 = internal::ParseContext::Done(_tag,(char **)&ctx_local);
    if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_004d7dc6;
    ctx_local = (ParseContext *)internal::ReadTag((char *)ctx_local,(uint32_t *)&str,0);
    pPVar1 = _tag;
    switch((uint)str >> 3) {
    case 1:
      if (((uint)str & 0xff) == 10) {
        ctx_local = (ParseContext *)((long)&ctx_local[-1].data_.arena + 7);
        do {
          ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
          psVar3 = _internal_add_file_to_generate_abi_cxx11_(this);
          ctx_local = (ParseContext *)
                      internal::InlineGreedyStringParser(psVar3,(char *)ctx_local,_tag);
          internal::VerifyUTF8
                    (psVar3,"google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
          if (ctx_local == (ParseContext *)0x0) goto LAB_004d7de1;
          bVar2 = internal::EpsCopyInputStream::DataAvailable
                            (&_tag->super_EpsCopyInputStream,(char *)ctx_local);
        } while ((bVar2) && (bVar2 = internal::ExpectTag<10u>((char *)ctx_local), bVar2));
        goto LAB_004d7b25;
      }
      break;
    case 2:
      if (((uint)str & 0xff) != 0x12) break;
      psVar3 = _internal_mutable_parameter_abi_cxx11_(this);
      ctx_local = (ParseContext *)internal::InlineGreedyStringParser(psVar3,(char *)ctx_local,_tag);
      internal::VerifyUTF8(psVar3,"google.protobuf.compiler.CodeGeneratorRequest.parameter");
      goto joined_r0x004d7cb1;
    case 3:
      if (((uint)str & 0xff) == 0x1a) {
        msg = _internal_mutable_compiler_version(this);
        ctx_local = (ParseContext *)
                    internal::ParseContext::ParseMessage
                              (pPVar1,(MessageLite *)msg,(char *)ctx_local);
        goto joined_r0x004d7cb1;
      }
      break;
    default:
      break;
    case 0xf:
      if (((uint)str & 0xff) == 0x7a) {
        ctx_local = (ParseContext *)((long)&ctx_local[-1].data_.arena + 7);
        do {
          pPVar1 = _tag;
          ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
          msg_00 = _internal_add_proto_file(this);
          ctx_local = (ParseContext *)
                      internal::ParseContext::ParseMessage
                                (pPVar1,(MessageLite *)msg_00,(char *)ctx_local);
          if (ctx_local == (ParseContext *)0x0) goto LAB_004d7de1;
          bVar2 = internal::EpsCopyInputStream::DataAvailable
                            (&_tag->super_EpsCopyInputStream,(char *)ctx_local);
        } while ((bVar2) && (bVar2 = internal::ExpectTag<122u>((char *)ctx_local), bVar2));
        goto LAB_004d7b25;
      }
    }
    if (((uint)str == 0) || (((uint)str & 7) == 4)) {
      if (ctx_local != (ParseContext *)0x0) {
        internal::EpsCopyInputStream::SetLastTag(&_tag->super_EpsCopyInputStream,(uint)str);
        goto LAB_004d7dc6;
      }
      goto LAB_004d7de1;
    }
    tag_00 = (ulong)(uint)str;
    unknown = internal::InternalMetadata::mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                        (&(this->super_Message).super_MessageLite._internal_metadata_);
    ctx_local = (ParseContext *)internal::UnknownFieldParse(tag_00,unknown,(char *)ctx_local,_tag);
joined_r0x004d7cb1:
    if (ctx_local == (ParseContext *)0x0) {
LAB_004d7de1:
      ctx_local = (ParseContext *)0x0;
LAB_004d7dc6:
      internal::HasBits<1UL>::Or(&this->_has_bits_,(HasBits<1UL> *)((long)&str + 4));
      return (char *)ctx_local;
    }
  } while( true );
}

Assistant:

const char* CodeGeneratorRequest::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated string file_to_generate = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            auto str = _internal_add_file_to_generate();
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
            #ifndef NDEBUG
            ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
            #endif  // !NDEBUG
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else
          goto handle_unusual;
        continue;
      // optional string parameter = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          auto str = _internal_mutable_parameter();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.compiler.CodeGeneratorRequest.parameter");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional .google.protobuf.compiler.Version compiler_version = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_compiler_version(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 122)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_proto_file(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<122>(ptr));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}